

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kws_detections.c
# Opt level: O2

char * kws_detections_hyp_str(kws_detections_t *detections,int frame,int delay)

{
  kws_detections_t kVar1;
  undefined8 *puVar2;
  size_t sVar3;
  char *pcVar4;
  gnode_s *pgVar5;
  glist_t pgVar6;
  int iVar7;
  gnode_s **ppgVar8;
  char *pcVar9;
  char *__dest;
  
  iVar7 = 0;
  ppgVar8 = &detections->detect_list;
  while (kVar1.detect_list = *ppgVar8, kVar1.detect_list != (glist_t)0x0) {
    if (*(int *)((long)((kVar1.detect_list)->data).ptr + 0xc) < frame - delay) {
      sVar3 = strlen(*((kVar1.detect_list)->data).ptr);
      iVar7 = iVar7 + (int)sVar3 + 1;
    }
    ppgVar8 = &(kVar1.detect_list)->next;
  }
  if (iVar7 == 0) {
    pcVar4 = (char *)0x0;
  }
  else {
    pcVar4 = (char *)__ckd_calloc__((long)iVar7,1,
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/kws_detections.c"
                                    ,0x67);
    pgVar5 = glist_reverse(detections->detect_list);
    detections->detect_list = pgVar5;
    __dest = pcVar4;
    for (; pgVar5 != (glist_t)0x0; pgVar5 = pgVar5->next) {
      puVar2 = (undefined8 *)(pgVar5->data).ptr;
      if (*(int *)((long)puVar2 + 0xc) < frame - delay) {
        pcVar9 = (char *)*puVar2;
        sVar3 = strlen(pcVar9);
        memcpy(__dest,pcVar9,sVar3);
        sVar3 = strlen((char *)*puVar2);
        pcVar9 = __dest + sVar3;
        __dest = pcVar9 + 1;
        *pcVar9 = ' ';
      }
    }
    if (pcVar4 < __dest) {
      __dest[-1] = '\0';
    }
    pgVar6 = glist_reverse(detections->detect_list);
    detections->detect_list = pgVar6;
  }
  return pcVar4;
}

Assistant:

char *
kws_detections_hyp_str(kws_detections_t *detections, int frame, int delay)
{
    gnode_t *gn;
    char *c;
    int len;
    char *hyp_str;

    len = 0;
    for (gn = detections->detect_list; gn; gn = gnode_next(gn)) {
	kws_detection_t *det = (kws_detection_t *)gnode_ptr(gn);
	if (det->ef < frame - delay) {
	    len += strlen(det->keyphrase) + 1;
	}
    }

    if (len == 0) {
        return NULL;
    }

    hyp_str = (char *)ckd_calloc(len, sizeof(char));
    c = hyp_str;
    detections->detect_list = glist_reverse(detections->detect_list);
    for (gn = detections->detect_list; gn; gn = gnode_next(gn)) {
	kws_detection_t *det = (kws_detection_t *)gnode_ptr(gn);
	if (det->ef < frame - delay) {
            memcpy(c, det->keyphrase, strlen(det->keyphrase));
    	    c += strlen(det->keyphrase);
    	    *c = ' ';
    	    c++;
    	}
    }
    if (c > hyp_str) {
        c--;
	*c = '\0';
    }
    detections->detect_list = glist_reverse(detections->detect_list);
    return hyp_str;
}